

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

void __thiscall Js::JavascriptRegExp::CacheLastIndex(JavascriptRegExp *this)

{
  Var aValue;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type TVar4;
  double value;
  
  aValue = (this->lastIndexVar).ptr;
  TVar4 = 0;
  if (aValue == (Var)0x0) goto LAB_00d04f58;
  if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) goto LAB_00d04eca;
    value = JavascriptConversion::ToInteger_Full
                      (aValue,(((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                              ptr);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
LAB_00d04eca:
    value = (double)(int)aValue;
  }
  bVar2 = NumberUtilities::IsNan(value);
  if (!bVar2) {
    bVar2 = NumberUtilities::IsSpecial(value,0x7ff0000000000000);
    TVar4 = 0xffffffff;
    if (!bVar2) {
      bVar2 = NumberUtilities::IsSpecial(value,0xfff0000000000000);
      TVar4 = (Type)(long)value;
      if (bVar2) {
        TVar4 = 0xffffffff;
      }
      if (value < 0.0) {
        TVar4 = 0xffffffff;
      }
      if (2147483646.0 < value) {
        TVar4 = 0xffffffff;
      }
    }
  }
LAB_00d04f58:
  this->lastIndexOrFlag = TVar4;
  return;
}

Assistant:

void JavascriptRegExp::CacheLastIndex()
    {
        if (lastIndexVar == nullptr)
            lastIndexOrFlag = 0;
        else
        {
            // Does ToInteger(lastIndex) yield an integer in [0, MaxCharCount]?
            double v = JavascriptConversion::ToInteger(lastIndexVar, GetScriptContext());
            if (JavascriptNumber::IsNan(v))
                lastIndexOrFlag = 0;
            else if (JavascriptNumber::IsPosInf(v) ||
                JavascriptNumber::IsNegInf(v) ||
                v < 0.0 ||
                v > (double)MaxCharCount)
                lastIndexOrFlag = InvalidValue;
            else
                lastIndexOrFlag = (CharCount)v;
        }
    }